

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O2

void af_glyph_hints_save(AF_GlyphHints hints,FT_Outline *outline)

{
  FT_Pos FVar1;
  AF_Point_conflict pAVar2;
  AF_Point_conflict pAVar3;
  FT_Vector *pFVar4;
  char *pcVar5;
  char cVar6;
  
  pAVar2 = hints->points;
  pAVar3 = pAVar2 + hints->num_points;
  pFVar4 = outline->points;
  pcVar5 = outline->tags;
  for (; pAVar2 < pAVar3; pAVar2 = pAVar2 + 1) {
    FVar1 = pAVar2->y;
    pFVar4->x = pAVar2->x;
    pFVar4->y = FVar1;
    cVar6 = '\x02' - ((pAVar2->flags & 2) == 0);
    if ((pAVar2->flags & 1) != 0) {
      cVar6 = '\0';
    }
    *pcVar5 = cVar6;
    pFVar4 = pFVar4 + 1;
    pcVar5 = pcVar5 + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_save( AF_GlyphHints  hints,
                       FT_Outline*    outline )
  {
    AF_Point    point = hints->points;
    AF_Point    limit = point + hints->num_points;
    FT_Vector*  vec   = outline->points;
    char*       tag   = outline->tags;


    for ( ; point < limit; point++, vec++, tag++ )
    {
      vec->x = point->x;
      vec->y = point->y;

      if ( point->flags & AF_FLAG_CONIC )
        tag[0] = FT_CURVE_TAG_CONIC;
      else if ( point->flags & AF_FLAG_CUBIC )
        tag[0] = FT_CURVE_TAG_CUBIC;
      else
        tag[0] = FT_CURVE_TAG_ON;
    }
  }